

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaQbf.c
# Opt level: O2

int Gia_ManSatEnum(Gia_Man_t *pGia,int nConfLimit,int nTimeOut,int fVerbose)

{
  int iVar1;
  int iVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int Lit;
  uint uVar7;
  abctime aVar8;
  Cnf_Dat_t *p;
  sat_solver *s;
  Vec_Int_t *p_00;
  abctime aVar9;
  abctime time;
  int iVar10;
  char *__format;
  uint uVar11;
  uint local_5c;
  
  aVar8 = Abc_Clock();
  p = (Cnf_Dat_t *)Mf_ManGenerateCnf(pGia,8,0,1,0,0);
  s = (sat_solver *)Cnf_DataWriteIntoSolver(p,1,0);
  iVar10 = pGia->nRegs;
  iVar1 = p->nVars;
  iVar2 = pGia->vCis->nSize;
  Cnf_DataFree(p);
  p_00 = Vec_IntAlloc(pGia->vCis->nSize - pGia->nRegs);
  uVar11 = 0;
  local_5c = 1;
  while( true ) {
    bVar3 = false;
    iVar4 = sat_solver_solve(s,(lit *)0x0,(lit *)0x0,(long)nConfLimit,0,0,0);
    if (iVar4 == -1) break;
    if (iVar4 == 0) {
      iVar10 = 0;
      goto LAB_00610c3f;
    }
    p_00->nSize = 0;
    for (iVar4 = 0; iVar4 < pGia->vCis->nSize - pGia->nRegs; iVar4 = iVar4 + 1) {
      iVar6 = ((iVar10 + iVar1) - iVar2) + iVar4;
      iVar5 = sat_solver_var_value(s,iVar6);
      iVar6 = Abc_Var2Lit(iVar6,iVar5);
      Vec_IntPush(p_00,iVar6);
    }
    if (fVerbose == 0) {
      iVar4 = p_00->nSize;
    }
    else {
      iVar5 = 0;
      printf("%5d : ",(ulong)local_5c);
      iVar4 = p_00->nSize;
      iVar6 = 0;
      if (0 < iVar4) {
        iVar6 = iVar4;
      }
      for (; iVar6 != iVar5; iVar5 = iVar5 + 1) {
        Lit = Vec_IntEntry(p_00,iVar5);
        uVar7 = Abc_LitIsCompl(Lit);
        printf("%d",(ulong)(uVar7 ^ 1));
      }
      putchar(10);
    }
    uVar11 = uVar11 + 1;
    iVar4 = sat_solver_addclause(s,p_00->pArray,p_00->pArray + iVar4);
    if (iVar4 == 0) break;
    if (nTimeOut != 0) {
      aVar9 = Abc_Clock();
      if ((long)nTimeOut <= (aVar9 - aVar8) / 1000000) {
        bVar3 = false;
        iVar10 = 0;
        goto LAB_00610c3f;
      }
    }
    local_5c = local_5c + 1;
  }
  bVar3 = true;
  iVar10 = 1;
LAB_00610c3f:
  sat_solver_delete(s);
  Vec_IntFree(p_00);
  if (nTimeOut == 0) {
LAB_00610c71:
    if (nConfLimit == 0 || bVar3) {
      printf("Enumerated the complete set of %d assignments.  ",(ulong)uVar11);
      goto LAB_00610cb3;
    }
    __format = "Enumerated %d assignments when conflict limit (%d) was reached.  ";
  }
  else {
    aVar9 = Abc_Clock();
    if ((aVar9 - aVar8) / 1000000 < (long)nTimeOut) goto LAB_00610c71;
    __format = "Enumerated %d assignments when timeout (%d sec) was reached.  ";
    nConfLimit = nTimeOut;
  }
  printf(__format,(ulong)uVar11,(ulong)(uint)nConfLimit);
LAB_00610cb3:
  aVar9 = Abc_Clock();
  Abc_PrintTime(0x816bba,(char *)(aVar9 - aVar8),time);
  return iVar10;
}

Assistant:

int Gia_ManSatEnum( Gia_Man_t * pGia, int nConfLimit, int nTimeOut, int fVerbose )
{
    Cnf_Dat_t * pCnf;
    sat_solver * pSat;
    Vec_Int_t * vLits;
    int i, iLit, iParVarBeg, Iter;
    int nSolutions = 0, RetValue = 0;
    abctime clkStart = Abc_Clock();
    pCnf = (Cnf_Dat_t *)Mf_ManGenerateCnf( pGia, 8, 0, 1, 0, 0 );
    pSat = (sat_solver *)Cnf_DataWriteIntoSolver( pCnf, 1, 0 );
    iParVarBeg = pCnf->nVars - Gia_ManPiNum(pGia);// - 1;
    Cnf_DataFree( pCnf );
    // iterate through the SAT assignment
    vLits = Vec_IntAlloc( Gia_ManPiNum(pGia) );
    for ( Iter = 1 ; ; Iter++ )
    {
        int status = sat_solver_solve( pSat, NULL, NULL, (ABC_INT64_T)nConfLimit, 0, 0, 0 );
        if ( status == l_False ) { RetValue =  1; break; }
        if ( status == l_Undef ) { RetValue =  0; break; }
        nSolutions++;
        // extract SAT assignment
        Vec_IntClear( vLits );
        for ( i = 0; i < Gia_ManPiNum(pGia); i++ )
            Vec_IntPush( vLits, Abc_Var2Lit(iParVarBeg+i, sat_solver_var_value(pSat, iParVarBeg+i)) );
        if ( fVerbose )
        {
            printf( "%5d : ", Iter );
            Vec_IntForEachEntry( vLits, iLit, i )
                printf( "%d", !Abc_LitIsCompl(iLit) );
            printf( "\n" );
        }
        // add clause
        if ( !sat_solver_addclause( pSat, Vec_IntArray(vLits), Vec_IntArray(vLits) + Vec_IntSize(vLits) ) )
            { RetValue =  1; break; }
        if ( nTimeOut && (Abc_Clock() - clkStart)/CLOCKS_PER_SEC >= nTimeOut ) { RetValue = 0; break; }
    }
    sat_solver_delete( pSat );
    Vec_IntFree( vLits );
    if ( nTimeOut && (Abc_Clock() - clkStart)/CLOCKS_PER_SEC >= nTimeOut )
        printf( "Enumerated %d assignments when timeout (%d sec) was reached.  ", nSolutions, nTimeOut );
    else if ( nConfLimit && !RetValue )
        printf( "Enumerated %d assignments when conflict limit (%d) was reached.  ", nSolutions, nConfLimit );
    else 
        printf( "Enumerated the complete set of %d assignments.  ", nSolutions );
    Abc_PrintTime( 1, "Time", Abc_Clock() - clkStart );
    return RetValue;
}